

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QMainWindowLayout *layout)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  QDebug local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.stream = *(Stream **)&layout->super_QLayout;
  *(int *)(local_38.stream + 0x28) = *(int *)(local_38.stream + 0x28) + 1;
  operator<<((Stream *)&stack0xffffffffffffffd0,(QDockAreaLayout *)&stack0xffffffffffffffc8);
  QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd0);
  QDebug::~QDebug(&stack0xffffffffffffffc8);
  uVar1 = *(undefined8 *)&layout->super_QLayout;
  *(undefined8 *)&layout->super_QLayout = 0;
  *(undefined8 *)debug.stream = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QMainWindowLayout *layout)
{
    debug << layout->layoutState.dockAreaLayout;
    return debug;
}